

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

int __thiscall booster::callback<int_()>::operator()(callback<int_()> *this)

{
  int iVar1;
  callable<int_()> *pcVar2;
  undefined8 uVar3;
  intrusive_ptr<booster::callable<int_()>_> *in_RDI;
  
  pcVar2 = intrusive_ptr<booster::callable<int_()>_>::get(in_RDI);
  if (pcVar2 == (callable<int_()> *)0x0) {
    uVar3 = __cxa_allocate_exception(0x30);
    bad_callback_call::bad_callback_call((bad_callback_call *)this);
    __cxa_throw(uVar3,&bad_callback_call::typeinfo,bad_callback_call::~bad_callback_call);
  }
  pcVar2 = intrusive_ptr<booster::callable<int_()>_>::operator*(in_RDI);
  iVar1 = (*(pcVar2->super_refcounted)._vptr_refcounted[2])();
  return iVar1;
}

Assistant:

Result operator()(Params ...args) const			
		{ 								
			if(!call_ptr.get()) throw bad_callback_call();		
			return (*call_ptr)(args...); 		
		}